

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

void __thiscall cmCacheManager::CacheEntry::SetProperty(CacheEntry *this,string *p,bool v)

{
  undefined7 in_register_00000011;
  char *pcVar1;
  char *pcVar2;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000011,v) == 0) {
    pcVar2 = "OFF";
    pcVar1 = "";
  }
  else {
    pcVar2 = "ON";
    pcVar1 = "";
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,pcVar2,pcVar1);
  SetProperty(this,p,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCacheManager::CacheEntry::SetProperty(const std::string& p, bool v)
{
  this->SetProperty(p, v ? std::string{ "ON" } : std::string{ "OFF" });
}